

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load_string(xml_document *this,char_t *contents,uint options)

{
  undefined8 in_RSI;
  xml_parse_result *in_RDI;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  xml_document *in_stack_00000010;
  xml_encoding encoding;
  
  impl::anon_unknown_0::strlength((char_t *)0xecee31);
  load_buffer(in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint)((ulong)in_RSI >> 0x20),
              (xml_encoding)in_RSI);
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load_string(const char_t* contents, unsigned int options)
	{
		// Force native encoding (skip autodetection)
	#ifdef PUGIXML_WCHAR_MODE
		xml_encoding encoding = encoding_wchar;
	#else
		xml_encoding encoding = encoding_utf8;
	#endif

		return load_buffer(contents, impl::strlength(contents) * sizeof(char_t), options, encoding);
	}